

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cinproc.c
# Opt level: O0

void nn_cinproc_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  void *pvVar1;
  nn_list *self_00;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  nn_sinproc *peer;
  nn_sinproc *sinproc;
  nn_cinproc *cinproc;
  nn_sinproc *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  nn_fsm *in_stack_ffffffffffffffa8;
  nn_ep *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  int src_00;
  int iVar2;
  long local_38;
  
  src_00 = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_38 = in_RDI;
  if (in_RDI == 0) {
    local_38 = 0;
  }
  iVar2 = *(int *)(local_38 + 0x58);
  if (iVar2 == 1) {
    if (in_ESI != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)(local_38 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/cinproc.c"
              ,0xc9);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)(local_38 + 0x58),0xfffffffe,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/cinproc.c"
              ,0xc5);
      fflush(_stderr);
      nn_err_abort();
    }
    *(undefined4 *)(local_38 + 0x58) = 2;
  }
  else {
    if (iVar2 != 2) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
              (ulong)*(uint *)(local_38 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/cinproc.c"
              ,0xf7);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_ESI == 1) {
      if (in_EDX == 6) {
        nn_ep_stat_increment
                  ((nn_ep *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98);
      }
    }
    else {
      if (in_ESI != 0x6c41) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)*(uint *)(local_38 + 0x58),(ulong)in_ESI,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/cinproc.c"
                ,0xf0);
        fflush(_stderr);
        nn_err_abort();
      }
      if (in_EDX != 1) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)(local_38 + 0x58),0x6c41,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/cinproc.c"
                ,0xe3);
        fflush(_stderr);
        nn_err_abort();
      }
      pvVar1 = nn_alloc_(0x1e592e);
      if (pvVar1 == (void *)0x0) {
        nn_backtrace_print();
        fprintf(_stderr,"Out of memory (%s:%d)\n",
                "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/inproc/cinproc.c"
                ,0xd7);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_sinproc_init((nn_sinproc *)CONCAT44(iVar2,in_ESI),src_00,in_stack_ffffffffffffffb0,
                      in_stack_ffffffffffffffa8);
      self_00 = (nn_list *)(local_38 + 0x80);
      nn_list_end((nn_list *)(local_38 + 0x80));
      nn_list_insert(self_00,(nn_list_item *)in_stack_ffffffffffffffa8,
                     (nn_list_item *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
      nn_sinproc_accept((nn_sinproc *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                        in_stack_ffffffffffffff98);
      nn_ep_stat_increment
                ((nn_ep *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98);
      nn_ep_stat_increment
                ((nn_ep *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                 (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98);
    }
  }
  return;
}

Assistant:

static void nn_cinproc_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_cinproc *cinproc;
    struct nn_sinproc *sinproc;
    struct nn_sinproc *peer;

    cinproc = nn_cont (self, struct nn_cinproc, fsm);


    switch (cinproc->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_CINPROC_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                cinproc->state = NN_CINPROC_STATE_ACTIVE;
                return;
            default:
                nn_fsm_bad_action (cinproc->state, src, type);
            }

        default:
            nn_fsm_bad_source (cinproc->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/******************************************************************************/
    case NN_CINPROC_STATE_ACTIVE:
        switch (src) {
        case NN_SINPROC_SRC_PEER:
            peer = (struct nn_sinproc*) srcptr;

            switch (type) {
            case NN_SINPROC_CONNECT:
                sinproc = nn_alloc (sizeof (struct nn_sinproc), "sinproc");
                alloc_assert (sinproc);
                nn_sinproc_init (sinproc, NN_CINPROC_SRC_SINPROC,
                    cinproc->item.ep, &cinproc->fsm);
                nn_list_insert (&cinproc->sinprocs, &sinproc->item,
                    nn_list_end (&cinproc->sinprocs));
                nn_sinproc_accept (sinproc, peer);
                nn_ep_stat_increment (cinproc->item.ep,
                    NN_STAT_INPROGRESS_CONNECTIONS, -1);
                nn_ep_stat_increment (cinproc->item.ep,
                    NN_STAT_ESTABLISHED_CONNECTIONS, 1);
                return;
            default:
                nn_fsm_bad_action (cinproc->state, src, type);
            }

        case NN_CINPROC_SRC_SINPROC:
            switch (type) {
            case NN_SINPROC_DISCONNECT:
                nn_ep_stat_increment (cinproc->item.ep,
                    NN_STAT_INPROGRESS_CONNECTIONS, 1);
                return;
            }
            return;

        default:
            nn_fsm_bad_source (cinproc->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (cinproc->state, src, type);
    }
}